

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ConditionalStatementSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ConditionalStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  ConditionalPredicateSyntax *node;
  StatementSyntax *node_00;
  SyntaxNode *local_80;
  size_t index_local;
  ConditionalStatementSyntax *this_local;
  
  switch(index) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&((this->super_StatementSyntax).label)->super_SyntaxNode);
    break;
  case 1:
    local_80 = (SyntaxNode *)0x0;
    if (this != (ConditionalStatementSyntax *)0xffffffffffffffe8) {
      local_80 = &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  case 2:
    token.kind = (this->uniqueOrPriority).kind;
    token._2_1_ = (this->uniqueOrPriority).field_0x2;
    token.numFlags.raw = (this->uniqueOrPriority).numFlags.raw;
    token.rawLen = (this->uniqueOrPriority).rawLen;
    token.info = (this->uniqueOrPriority).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    token_00.kind = (this->ifKeyword).kind;
    token_00._2_1_ = (this->ifKeyword).field_0x2;
    token_00.numFlags.raw = (this->ifKeyword).numFlags.raw;
    token_00.rawLen = (this->ifKeyword).rawLen;
    token_00.info = (this->ifKeyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 4:
    token_01.kind = (this->openParen).kind;
    token_01._2_1_ = (this->openParen).field_0x2;
    token_01.numFlags.raw = (this->openParen).numFlags.raw;
    token_01.rawLen = (this->openParen).rawLen;
    token_01.info = (this->openParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 5:
    node = not_null<slang::syntax::ConditionalPredicateSyntax_*>::get(&this->predicate);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node->super_SyntaxNode);
    break;
  case 6:
    token_02.kind = (this->closeParen).kind;
    token_02._2_1_ = (this->closeParen).field_0x2;
    token_02.numFlags.raw = (this->closeParen).numFlags.raw;
    token_02.rawLen = (this->closeParen).rawLen;
    token_02.info = (this->closeParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 7:
    node_00 = not_null<slang::syntax::StatementSyntax_*>::get(&this->statement);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node_00->super_SyntaxNode);
    break;
  case 8:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->elseClause->super_SyntaxNode);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ConditionalStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return uniqueOrPriority;
        case 3: return ifKeyword;
        case 4: return openParen;
        case 5: return predicate.get();
        case 6: return closeParen;
        case 7: return statement.get();
        case 8: return elseClause;
        default: return nullptr;
    }
}